

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorProto::_internal_has_options(FileDescriptorProto *this)

{
  uint32_t *puVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  byte local_11;
  FileDescriptorProto *pFStack_10;
  bool value;
  FileDescriptorProto *this_local;
  
  pFStack_10 = this;
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  local_11 = (*puVar1 & 8) != 0;
  local_51 = 0;
  if (((bool)local_11) && (this->options_ == (FileOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x2320);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (bool)(local_11 & 1);
}

Assistant:

inline bool FileDescriptorProto::_internal_has_options() const {
  bool value = (_has_bits_[0] & 0x00000008u) != 0;
  PROTOBUF_ASSUME(!value || options_ != nullptr);
  return value;
}